

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bit_cost.cpp
# Opt level: O3

double duckdb_brotli::BrotliPopulationCostDistance(HistogramDistance *histogram)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  bool bVar4;
  uint uVar5;
  ulong uVar6;
  int iVar7;
  long lVar8;
  uint32_t __brotli_swap_tmp;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  int iVar12;
  double dVar13;
  undefined4 uVar16;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  double dVar17;
  undefined1 auVar18 [16];
  double dVar19;
  double dVar20;
  double dVar21;
  uint32_t histo [4];
  size_t s [5];
  double local_c8;
  uint local_b8 [18];
  double local_70;
  double local_68;
  double local_60;
  long local_58 [5];
  
  uVar9 = histogram->total_count_;
  dVar19 = 12.0;
  if (uVar9 == 0) {
    return 12.0;
  }
  iVar12 = 0;
  lVar8 = 0;
  do {
    if (histogram->data_[lVar8] != 0) {
      local_58[iVar12] = lVar8;
      iVar7 = iVar12 + 1;
      bVar4 = 3 < iVar12;
      iVar12 = iVar7;
      if (bVar4) break;
    }
    lVar8 = lVar8 + 1;
  } while (lVar8 != 0x220);
  uVar16 = (undefined4)(uVar9 >> 0x20);
  switch(iVar12) {
  case 1:
    break;
  case 2:
    auVar14._8_4_ = uVar16;
    auVar14._0_8_ = uVar9;
    auVar14._12_4_ = 0x45300000;
    dVar19 = (auVar14._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)uVar9) - 4503599627370496.0) + 20.0;
    break;
  case 3:
    uVar3 = histogram->data_[local_58[0]];
    uVar1 = histogram->data_[local_58[1]];
    uVar2 = histogram->data_[local_58[2]];
    uVar5 = uVar2;
    if (uVar2 < uVar1) {
      uVar5 = uVar1;
    }
    if (uVar5 < uVar3) {
      uVar5 = uVar3;
    }
    dVar19 = (double)((uVar1 + uVar3 + uVar2) * 2) + 28.0;
    goto LAB_003223dd;
  case 4:
    lVar8 = 0;
    do {
      local_b8[lVar8] = histogram->data_[local_58[lVar8]];
      lVar8 = lVar8 + 1;
    } while (lVar8 != 4);
    uVar9 = 0;
    do {
      if (uVar9 < 3) {
        uVar5 = local_b8[uVar9];
        uVar10 = uVar9;
        do {
          uVar3 = local_b8[uVar10 + 1];
          if (uVar5 < uVar3) {
            local_b8[uVar10 + 1] = uVar5;
            local_b8[uVar9] = uVar3;
            uVar5 = uVar3;
          }
          uVar10 = uVar10 + 1;
        } while (uVar10 < 3);
      }
      uVar9 = uVar9 + 1;
    } while (uVar9 != 4);
    local_b8[3] = local_b8[3] + local_b8[2];
    uVar5 = local_b8[0];
    if (local_b8[0] < local_b8[3]) {
      uVar5 = local_b8[3];
    }
    dVar19 = (double)((local_b8[0] + local_b8[1]) * 2) + (double)(local_b8[3] * 3) + 37.0;
LAB_003223dd:
    dVar19 = dVar19 - (double)uVar5;
    break;
  default:
    local_b8[0xc] = 0;
    local_b8[0xd] = 0;
    local_b8[0xe] = 0;
    local_b8[0xf] = 0;
    local_b8[8] = 0;
    local_b8[9] = 0;
    local_b8[10] = 0;
    local_b8[0xb] = 0;
    local_b8[4] = 0;
    local_b8[5] = 0;
    local_b8[6] = 0;
    local_b8[7] = 0;
    local_b8[0] = 0;
    local_b8[1] = 0;
    local_b8[2] = 0;
    local_b8[3] = 0;
    local_b8[0x10] = 0;
    local_b8[0x11] = 0;
    if (uVar9 < 0x100) {
      dVar20 = (double)(&kBrotliLog2Table)[uVar9];
    }
    else {
      auVar18._8_4_ = uVar16;
      auVar18._0_8_ = uVar9;
      auVar18._12_4_ = 0x45300000;
      dVar20 = log2((auVar18._8_8_ - 1.9342813113834067e+25) +
                    ((double)CONCAT44(0x43300000,(int)uVar9) - 4503599627370496.0));
    }
    dVar19 = 0.0;
    uVar9 = 1;
    iVar12 = 0;
    uVar10 = 0;
    do {
      uVar5 = histogram->data_[uVar10];
      if ((ulong)uVar5 == 0) {
        if (uVar10 < 0x21f) {
          uVar5 = 0x220 - (int)uVar10;
          lVar8 = 0;
          do {
            if (histogram->data_[uVar10 + lVar8 + 1] != 0) {
              uVar5 = (int)lVar8 + 1;
              break;
            }
            lVar8 = lVar8 + 1;
          } while (0x21f - uVar10 != lVar8);
          uVar10 = uVar10 + uVar5;
          if (uVar10 == 0x220) break;
          if (2 < uVar5) {
            uVar5 = uVar5 - 2;
            do {
              iVar12 = iVar12 + 1;
              dVar19 = dVar19 + 3.0;
              bVar4 = 7 < uVar5;
              uVar5 = uVar5 >> 3;
            } while (bVar4);
            goto LAB_003225bb;
          }
        }
        else {
          uVar10 = uVar10 + 1;
          uVar5 = 1;
          if (uVar10 == 0x220) break;
        }
        local_b8[0] = local_b8[0] + uVar5;
      }
      else {
        if (uVar5 < 0x100) {
          dVar21 = (double)(&kBrotliLog2Table)[uVar5];
        }
        else {
          dVar21 = log2((double)uVar5);
          uVar5 = histogram->data_[uVar10];
        }
        dVar17 = (dVar20 - dVar21) + 0.5;
        uVar6 = (ulong)dVar17;
        uVar6 = (long)(dVar17 - 9.223372036854776e+18) & (long)uVar6 >> 0x3f | uVar6;
        dVar19 = dVar19 + (double)uVar5 * (dVar20 - dVar21);
        if (0xe < uVar6) {
          uVar6 = 0xf;
        }
        if (uVar9 < uVar6) {
          uVar9 = uVar6;
        }
        local_b8[uVar6 & 0xffffffff] = local_b8[uVar6 & 0xffffffff] + 1;
        uVar10 = uVar10 + 1;
      }
LAB_003225bb:
    } while (uVar10 < 0x220);
    local_70 = (double)(long)(uVar9 * 2 + 0x12);
    local_b8[0x11] = iVar12;
    dVar20 = 0.0;
    uVar10 = 0xfffffffffffffff8;
    uVar9 = 0;
    do {
      uVar5 = *(uint *)((long)local_b8 + uVar10 + 8);
      uVar6 = (ulong)uVar5;
      if (uVar6 < 0x100) {
        dVar21 = (double)(&kBrotliLog2Table)[uVar6];
        local_c8 = (double)(int)uVar5;
      }
      else {
        local_c8 = (double)uVar6;
        dVar21 = log2(local_c8);
      }
      uVar11 = (ulong)*(uint *)((long)local_b8 + uVar10 + 0xc);
      dVar17 = (double)uVar11;
      if (uVar11 < 0x100) {
        dVar13 = (double)(&kBrotliLog2Table)[uVar11];
      }
      else {
        local_68 = dVar17;
        local_60 = dVar21;
        dVar13 = log2(dVar17);
        dVar21 = local_60;
        dVar17 = local_68;
      }
      uVar9 = uVar9 + uVar6 + uVar11;
      dVar20 = (dVar20 - local_c8 * dVar21) - dVar17 * dVar13;
      uVar10 = uVar10 + 8;
    } while (uVar10 < 0x40);
    dVar19 = dVar19 + local_70;
    auVar15._8_4_ = (int)(uVar9 >> 0x20);
    auVar15._0_8_ = uVar9;
    auVar15._12_4_ = 0x45300000;
    dVar21 = (auVar15._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)uVar9) - 4503599627370496.0);
    if (uVar9 != 0) {
      if (uVar9 < 0x100) {
        dVar17 = (double)(&kBrotliLog2Table)[uVar9];
      }
      else {
        dVar17 = log2(dVar21);
      }
      dVar20 = dVar20 + dVar17 * dVar21;
    }
    if (dVar21 <= dVar20) {
      dVar21 = dVar20;
    }
    dVar19 = dVar19 + dVar21;
  }
  return dVar19;
}

Assistant:

double FN(BrotliPopulationCost)(const HistogramType* histogram) {
  static const double kOneSymbolHistogramCost = 12;
  static const double kTwoSymbolHistogramCost = 20;
  static const double kThreeSymbolHistogramCost = 28;
  static const double kFourSymbolHistogramCost = 37;
  const size_t data_size = FN(HistogramDataSize)();
  int count = 0;
  size_t s[5];
  double bits = 0.0;
  size_t i;
  if (histogram->total_count_ == 0) {
    return kOneSymbolHistogramCost;
  }
  for (i = 0; i < data_size; ++i) {
    if (histogram->data_[i] > 0) {
      s[count] = i;
      ++count;
      if (count > 4) break;
    }
  }
  if (count == 1) {
    return kOneSymbolHistogramCost;
  }
  if (count == 2) {
    return (kTwoSymbolHistogramCost + (double)histogram->total_count_);
  }
  if (count == 3) {
    const uint32_t histo0 = histogram->data_[s[0]];
    const uint32_t histo1 = histogram->data_[s[1]];
    const uint32_t histo2 = histogram->data_[s[2]];
    const uint32_t histomax =
        BROTLI_MAX(uint32_t, histo0, BROTLI_MAX(uint32_t, histo1, histo2));
    return (kThreeSymbolHistogramCost +
            2 * (histo0 + histo1 + histo2) - histomax);
  }
  if (count == 4) {
    uint32_t histo[4];
    uint32_t h23;
    uint32_t histomax;
    for (i = 0; i < 4; ++i) {
      histo[i] = histogram->data_[s[i]];
    }
    /* Sort */
    for (i = 0; i < 4; ++i) {
      size_t j;
      for (j = i + 1; j < 4; ++j) {
        if (histo[j] > histo[i]) {
          BROTLI_SWAP(uint32_t, histo, j, i);
        }
      }
    }
    h23 = histo[2] + histo[3];
    histomax = BROTLI_MAX(uint32_t, h23, histo[0]);
    return (kFourSymbolHistogramCost +
            3 * h23 + 2 * (histo[0] + histo[1]) - histomax);
  }

  {
    /* In this loop we compute the entropy of the histogram and simultaneously
       build a simplified histogram of the code length codes where we use the
       zero repeat code 17, but we don't use the non-zero repeat code 16. */
    size_t max_depth = 1;
    uint32_t depth_histo[BROTLI_CODE_LENGTH_CODES] = { 0 };
    const double log2total = FastLog2(histogram->total_count_);
    for (i = 0; i < data_size;) {
      if (histogram->data_[i] > 0) {
        /* Compute -log2(P(symbol)) = -log2(count(symbol)/total_count) =
                                    = log2(total_count) - log2(count(symbol)) */
        double log2p = log2total - FastLog2(histogram->data_[i]);
        /* Approximate the bit depth by round(-log2(P(symbol))) */
        size_t depth = (size_t)(log2p + 0.5);
        bits += histogram->data_[i] * log2p;
        if (depth > 15) {
          depth = 15;
        }
        if (depth > max_depth) {
          max_depth = depth;
        }
        ++depth_histo[depth];
        ++i;
      } else {
        /* Compute the run length of zeros and add the appropriate number of 0
           and 17 code length codes to the code length code histogram. */
        uint32_t reps = 1;
        size_t k;
        for (k = i + 1; k < data_size && histogram->data_[k] == 0; ++k) {
          ++reps;
        }
        i += reps;
        if (i == data_size) {
          /* Don't add any cost for the last zero run, since these are encoded
             only implicitly. */
          break;
        }
        if (reps < 3) {
          depth_histo[0] += reps;
        } else {
          reps -= 2;
          while (reps > 0) {
            ++depth_histo[BROTLI_REPEAT_ZERO_CODE_LENGTH];
            /* Add the 3 extra bits for the 17 code length code. */
            bits += 3;
            reps >>= 3;
          }
        }
      }
    }
    /* Add the estimated encoding cost of the code length code histogram. */
    bits += (double)(18 + 2 * max_depth);
    /* Add the entropy of the code length code histogram. */
    bits += BitsEntropy(depth_histo, BROTLI_CODE_LENGTH_CODES);
  }
  return bits;
}